

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btCollisionWorld::contactPairTest
          (btCollisionWorld *this,btCollisionObject *colObjA,btCollisionObject *colObjB,
          ContactResultCallback *resultCallback)

{
  int iVar1;
  undefined4 extraout_var;
  btCollisionObjectWrapper obB;
  btCollisionObjectWrapper obA;
  btBridgedManifoldResult contactPointResult;
  btCollisionObjectWrapper local_b8;
  btCollisionObjectWrapper local_90;
  btManifoldResult local_68;
  ContactResultCallback *local_38;
  long *plVar2;
  
  local_90.m_shape = colObjA->m_collisionShape;
  local_90.m_parent = (btCollisionObjectWrapper *)0x0;
  local_90.m_worldTransform = &colObjA->m_worldTransform;
  local_90.m_partId = -1;
  local_90.m_index = -1;
  local_b8.m_shape = colObjB->m_collisionShape;
  local_b8.m_parent = (btCollisionObjectWrapper *)0x0;
  local_b8.m_worldTransform = &colObjB->m_worldTransform;
  local_b8.m_partId = -1;
  local_b8.m_index = -1;
  local_b8.m_collisionObject = colObjB;
  local_90.m_collisionObject = colObjA;
  iVar1 = (*this->m_dispatcher1->_vptr_btDispatcher[2])(this->m_dispatcher1,&local_90,&local_b8,0);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    btManifoldResult::btManifoldResult(&local_68,&local_90,&local_b8);
    local_68.super_Result._vptr_Result = (_func_int **)&PTR__Result_00223ca0;
    local_38 = resultCallback;
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_90,&local_b8,&this->m_dispatchInfo,&local_68);
    (**(code **)*plVar2)(plVar2);
    (*this->m_dispatcher1->_vptr_btDispatcher[0xf])(this->m_dispatcher1,plVar2);
  }
  return;
}

Assistant:

void	btCollisionWorld::contactPairTest(btCollisionObject* colObjA, btCollisionObject* colObjB, ContactResultCallback& resultCallback)
{
	btCollisionObjectWrapper obA(0,colObjA->getCollisionShape(),colObjA,colObjA->getWorldTransform(),-1,-1);
	btCollisionObjectWrapper obB(0,colObjB->getCollisionShape(),colObjB,colObjB->getWorldTransform(),-1,-1);

	btCollisionAlgorithm* algorithm = getDispatcher()->findAlgorithm(&obA,&obB);
	if (algorithm)
	{
		btBridgedManifoldResult contactPointResult(&obA,&obB, resultCallback);
		//discrete collision detection query
		algorithm->processCollision(&obA,&obB, getDispatchInfo(),&contactPointResult);

		algorithm->~btCollisionAlgorithm();
		getDispatcher()->freeCollisionAlgorithm(algorithm);
	}

}